

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O0

void __thiscall
QByteArrayMatcher::QByteArrayMatcher(QByteArrayMatcher *this,char *pattern,qsizetype length)

{
  size_t sVar1;
  uchar *in_RDX;
  undefined8 in_RSI;
  uchar *in_RDI;
  uchar *len;
  
  in_RDI[0] = '\0';
  in_RDI[1] = '\0';
  in_RDI[2] = '\0';
  in_RDI[3] = '\0';
  in_RDI[4] = '\0';
  in_RDI[5] = '\0';
  in_RDI[6] = '\0';
  in_RDI[7] = '\0';
  len = in_RDI;
  QByteArray::QByteArray((QByteArray *)0x1c6c21);
  *(undefined8 *)(in_RDI + 0x120) = in_RSI;
  if ((long)in_RDX < 0) {
    sVar1 = qstrlen((char *)in_RDI);
    *(size_t *)(in_RDI + 0x128) = sVar1;
  }
  else {
    *(uchar **)(in_RDI + 0x128) = in_RDX;
  }
  bm_init_skiptable(in_RDX,(qsizetype)len,in_RDI);
  return;
}

Assistant:

QByteArrayMatcher::QByteArrayMatcher(const char *pattern, qsizetype length) : d(nullptr)
{
    p.p = reinterpret_cast<const uchar *>(pattern);
    if (length < 0)
        p.l = qstrlen(pattern);
    else
        p.l = length;
    bm_init_skiptable(p.p, p.l, p.q_skiptable);
}